

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

RCOError __thiscall RCO::getStyleId(RCO *this,string *s,uint32_t offset)

{
  char *pcVar1;
  char buf [256];
  char acStack_118 [256];
  
  snprintf(acStack_118,0x100,"%x",
           (ulong)*(uint *)(this->mBuffer + (ulong)offset * 4 + (ulong)(this->mHeader).styles_off));
  pcVar1 = (char *)s->_M_string_length;
  strlen(acStack_118);
  std::__cxx11::string::_M_replace((ulong)s,0,pcVar1,(ulong)acStack_118);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getStyleId(std::string& s, uint32_t offset)
{
	uint32_t styleid;

	memcpy(&styleid, mBuffer + mHeader.styles_off + offset * sizeof(uint32_t), sizeof(uint32_t));

	char buf[256];
	snprintf(buf, 256, "%x", styleid);

	s = buf;

	return NO_ERROR;
}